

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> * __thiscall
libDAI::MaxPlus::beliefs
          (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
           *__return_storage_ptr__,MaxPlus *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  size_t I;
  ulong uVar3;
  Factor local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar1));
    if (uVar2 <= uVar3) break;
    beliefV(&local_58,this,uVar3);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               __return_storage_ptr__,&local_58);
    if (local_58._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
                      ((long *)CONCAT44(extraout_var_00,iVar1));
    if (uVar2 <= uVar3) break;
    beliefF(&local_58,this,uVar3);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               __return_storage_ptr__,&local_58);
    if (local_58._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Factor> MaxPlus::beliefs() const {
        vector<Factor> result;
        for( size_t i = 0; i < grm().nrVars(); i++ )
            result.push_back( beliefV(i) );
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            result.push_back( beliefF(I) );
        return result;
    }